

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.h
# Opt level: O1

Tester * __thiscall leveldb::test::Tester::IsOk(Tester *this,Status *s)

{
  string local_40;
  
  if (s->state_ != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x28," ",1);
    Status::ToString_abi_cxx11_(&local_40,s);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->field_0x28,local_40._M_dataplus._M_p,local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    this->ok_ = false;
  }
  return this;
}

Assistant:

Tester& IsOk(const Status& s) {
    if (!s.ok()) {
      ss_ << " " << s.ToString();
      ok_ = false;
    }
    return *this;
  }